

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

__pid_t __thiscall Process::wait(Process *this,void *__stat_loc)

{
  code *pcVar1;
  int iVar2;
  __pid_t _Var3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  bool bVar7;
  int status_1;
  siginfo_t sigInfo;
  int local_b4;
  siginfo_t local_b0;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
  if ((iVar2 != 0) &&
     (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x4ee,"pthread_mutex_lock(&ProcessFramework::mutex) == 0"), iVar2 != 0)
     ) goto LAB_00106c4a;
  if (ProcessFramework::signaled == -1) {
    ProcessFramework::signaled = 0;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x507;
  }
  else if (ProcessFramework::signaled == 0) {
    if (__stat_loc == (void *)0x0) {
      ProcessFramework::waitState = 1;
      do {
        iVar2 = pthread_cond_wait((pthread_cond_t *)&ProcessFramework::condition,
                                  (pthread_mutex_t *)&ProcessFramework::mutex);
        if ((iVar2 != 0) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                  ,0x4f7,
                                  "pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0"
                                 ), iVar2 != 0)) goto LAB_00106c4a;
      } while (ProcessFramework::signaled == 0);
      if ((-1 < ProcessFramework::signaled) &&
         (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x4fa,"ProcessFramework::signaled < 0"), iVar2 != 0))
      goto LAB_00106c4a;
      ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar2 == 0) {
        return 0;
      }
      uVar4 = 0x4fd;
    }
    else {
      ProcessFramework::waitState = 2;
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if ((iVar2 != 0) &&
         (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x514,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
         iVar2 != 0)) goto LAB_00106c4a;
      lVar5 = 0;
      iVar2 = waitid(P_ALL,0,&local_b0,0x1000004);
      if (iVar2 == -1) {
        return 0;
      }
      bVar7 = 0 < (long)__stat_loc;
      if ((0 < (long)__stat_loc) &&
         (lVar5 = *(long *)this, local_b0._sifields._pad[0] != *(int *)(lVar5 + 0xc))) {
        piVar6 = &this->fdStdInWrite;
        do {
          bVar7 = piVar6 < &this->fdStdOutRead + (long)__stat_loc * 2;
          if (!bVar7) break;
          lVar5 = *(long *)piVar6;
          piVar6 = piVar6 + 2;
        } while (local_b0._sifields._pad[0] != *(int *)(lVar5 + 0xc));
      }
      if (bVar7) {
        return (__pid_t)lVar5;
      }
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
      if ((iVar2 != 0) &&
         (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x51d,"pthread_mutex_lock(&ProcessFramework::mutex) == 0"),
         iVar2 != 0)) goto LAB_00106c4a;
      if ((local_b0._sifields._pad[0] == ProcessFramework::signaled) &&
         (_Var3 = waitpid(ProcessFramework::signaled,&local_b4,0),
         _Var3 == ProcessFramework::signaled)) {
        ProcessFramework::signaled = 0;
      }
      ProcessFramework::waitState = 0;
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar2 == 0) {
        return 0;
      }
      uVar4 = 0x526;
    }
  }
  else {
    _Var3 = waitpid(ProcessFramework::signaled,&local_b0.si_signo,0);
    if (_Var3 == ProcessFramework::signaled) {
      ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if (iVar2 == 0) {
      return 0;
    }
    uVar4 = 0x511;
  }
  iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                        ,uVar4,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0");
  if (iVar2 == 0) {
    return 0;
  }
LAB_00106c4a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Process* Process::wait(Process** processes, usize count)
{
#ifdef _WIN32
  EnterCriticalSection(&ProcessFramework::criticalSection);
  if(ProcessFramework::hInterruptEvent == INVALID_HANDLE_VALUE)
    ProcessFramework::hInterruptEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
  LeaveCriticalSection(&ProcessFramework::criticalSection);
  HANDLE handles[MAXIMUM_WAIT_OBJECTS];
  Process* processMap[MAXIMUM_WAIT_OBJECTS];
  Process** p = processMap;
  handles[0] = ProcessFramework::hInterruptEvent;
  Process** pend = processes + count;
  HANDLE* hend = handles + MAXIMUM_WAIT_OBJECTS;
  HANDLE* h = handles + 1;
  for(; processes < pend; ++processes)
  {
    Process* process = *processes;
    if(process->hProcess == INVALID_HANDLE_VALUE)
      continue;
    *(h++) = process->hProcess;
    *(p++) = process;
    if(h >= hend)
      break;
  }
  DWORD dw = WaitForMultipleObjects((DWORD)(h - handles), handles, FALSE, INFINITE);
  ssize pIndex;
  if(dw <= WAIT_OBJECT_0 || (pIndex = dw - (WAIT_OBJECT_0 + 1)) >= p - processMap)
    return 0;
  return processMap[pIndex];
#else
  VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
  switch(ProcessFramework::signaled)
  {
  case 0:
    if(count == 0)
    {
      ProcessFramework::waitState = 1;
      for(;;)
      {
        VERIFY(pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0);
        if(ProcessFramework::signaled)
        {
          ASSERT(ProcessFramework::signaled < 0);
          ProcessFramework::signaled = 0;
          ProcessFramework::waitState = 0;
          VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
          return 0;
        }
      }
    }
    else
      ProcessFramework::waitState = 2;
    break;
  case -1:
    ProcessFramework::signaled = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  default:
    {
      int status;
      pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
      if(pid == ProcessFramework::signaled)
        ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
    }
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  }
  VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  siginfo_t sigInfo;
  pid_t ret = waitid(P_ALL, 0, &sigInfo, WEXITED | WNOWAIT);
  if(ret != -1)
  {
    pid_t pid = sigInfo.si_pid;
    for(Process** end = processes + count; processes < end; ++processes)
      if(pid == (pid_t)(*processes)->pid)
        return *processes;
    VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
    if(pid == ProcessFramework::signaled)
    {
        int status;
        pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
        if(pid == ProcessFramework::signaled)
          ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  }
  return 0;
#endif
}